

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void __thiscall Log::LOG(Log *this,Address *addr,char *str,...)

{
  int iVar1;
  FILE *__stream;
  char in_AL;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_R8;
  ulong uVar7;
  undefined8 in_R9;
  FILE **ppFVar8;
  bool bVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string magic;
  va_list vararglist;
  undefined1 *local_118;
  ulong local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (LOG(Address*,char_const*,...)::dbg_opened == '\0') {
    LOG::numwrites = 0;
    LOG::stdstring2[0] = '\0';
    strcpy(LOG::stdstring3,LOG::stdstring2);
    sVar4 = strlen(LOG::stdstring2);
    builtin_strncpy(LOG::stdstring2 + sVar4,"dbg.log",8);
    sVar4 = strlen(LOG::stdstring3);
    builtin_strncpy(LOG::stdstring3 + sVar4,"stats.lo",8);
    (LOG::stdstring3 + sVar4 + 8)[0] = 'g';
    (LOG::stdstring3 + sVar4 + 8)[1] = '\0';
    LOG::fp = (FILE *)fopen(LOG::stdstring2,"w");
    LOG::fp2 = (FILE *)fopen(LOG::stdstring3,"w");
    LOG(Address*,char_const*,...)::dbg_opened = '\x01';
  }
  else {
    sprintf(LOG::stdstring,"%d.%d.%d.%d:%d ",(ulong)(uint)(int)addr->addr[0],
            (ulong)(uint)(int)addr->addr[1],(ulong)(uint)(int)addr->addr[2],
            (ulong)(uint)(int)addr->addr[3],(int)*(short *)(addr->addr + 4));
  }
  local_e8 = local_d8;
  local_f0 = &stack0x00000008;
  local_f8 = 0x3000000018;
  vsprintf(LOG::buffer,str,&local_f8);
  if (this->firstTime == false) {
    local_118 = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CS425","");
    uVar3 = (uint)local_110;
    if ((int)uVar3 < 1) {
      uVar2 = 0;
    }
    else {
      uVar6 = (ulong)(uVar3 - 1);
      if (local_110 < uVar3 - 1) {
        uVar6 = local_110;
      }
      uVar7 = 0;
      uVar2 = 0;
      do {
        if (local_110 == 0) {
          uVar5 = std::__throw_out_of_range_fmt
                            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                             uVar6);
          if (local_118 != local_108) {
            operator_delete(local_118);
          }
          _Unwind_Resume(uVar5);
        }
        uVar2 = uVar2 + (int)(char)local_118[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar7);
    }
    fprintf((FILE *)LOG::fp,"%x\n",(ulong)uVar2);
    this->firstTime = true;
    if (local_118 != local_108) {
      operator_delete(local_118);
    }
  }
  ppFVar8 = &LOG::fp;
  if (LOG::buffer._8_2_ == 0x2347 && LOG::buffer._0_8_ == 0x4f4c535441545323) {
    ppFVar8 = &LOG::fp2;
  }
  fprintf((FILE *)*ppFVar8,"\n %s",LOG::stdstring);
  __stream = (FILE *)*ppFVar8;
  uVar3 = Params::getcurrtime(this->par);
  fprintf(__stream,"[%d] ",(ulong)uVar3);
  fprintf((FILE *)*ppFVar8,LOG::buffer);
  iVar1 = LOG::numwrites + 1;
  bVar9 = -1 < LOG::numwrites;
  LOG::numwrites = iVar1;
  if (bVar9) {
    fflush((FILE *)LOG::fp);
    fflush((FILE *)LOG::fp2);
    LOG::numwrites = 0;
  }
  return;
}

Assistant:

void Log::LOG(Address *addr, const char * str, ...) {

	static FILE *fp;
	static FILE *fp2;
	va_list vararglist;
	static char buffer[30000];
	static int numwrites;
	static char stdstring[30];
	static char stdstring2[40];
	static char stdstring3[40]; 
	static int dbg_opened=0;

	if(dbg_opened != 639){
		numwrites=0;

		stdstring2[0]=0;

		strcpy(stdstring3, stdstring2);

		strcat(stdstring2, DBG_LOG);
		strcat(stdstring3, STATS_LOG);

		fp = fopen(stdstring2, "w");
		fp2 = fopen(stdstring3, "w");

		dbg_opened=639;
	}
	else 

	sprintf(stdstring, "%d.%d.%d.%d:%d ", addr->addr[0], addr->addr[1], addr->addr[2], addr->addr[3], *(short *)&addr->addr[4]);

	va_start(vararglist, str);
	vsprintf(buffer, str, vararglist);
	va_end(vararglist);

	if (!firstTime) {
		int magicNumber = 0;
		string magic = MAGIC_NUMBER;
		int len = magic.length();
		for ( int i = 0; i < len; i++ ) {
			magicNumber += (int)magic.at(i);
		}
		fprintf(fp, "%x\n", magicNumber);
		firstTime = true;
	}

	if(memcmp(buffer, "#STATSLOG#", 10)==0){
		fprintf(fp2, "\n %s", stdstring);
		fprintf(fp2, "[%d] ", par->getcurrtime());

		fprintf(fp2, buffer);
	}
	else{
		fprintf(fp, "\n %s", stdstring);
		fprintf(fp, "[%d] ", par->getcurrtime());
		fprintf(fp, buffer);

	}

	if(++numwrites >= MAXWRITES){
		fflush(fp);
		fflush(fp2);
		numwrites=0;
	}

}